

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTasks.cpp
# Opt level: O3

Expression * __thiscall
slang::ast::builtins::PrintTimeScaleTask::bindArgument
          (PrintTimeScaleTask *this,size_t argIndex,ASTContext *context,ExpressionSyntax *syntax,
          Args *args)

{
  Compilation *comp;
  bool bVar1;
  Expression *pEVar2;
  InvalidExpression *pIVar3;
  SourceRange sourceRange;
  void *local_20;
  
  if (argIndex != 0) {
    pEVar2 = SystemSubroutine::bindArgument((SystemSubroutine *)this,argIndex,context,syntax,args);
    return pEVar2;
  }
  comp = ((context->scope).ptr)->compilation;
  bVar1 = slang::syntax::NameSyntax::isKind((syntax->super_SyntaxNode).kind);
  if (bVar1) {
    pEVar2 = ArbitrarySymbolExpression::fromSyntax
                       (comp,(NameSyntax *)syntax,context,(bitmask<slang::ast::LookupFlags>)0x300);
    return pEVar2;
  }
  sourceRange = slang::syntax::SyntaxNode::sourceRange(&syntax->super_SyntaxNode);
  ASTContext::addDiag(context,(DiagCode)0xb000b,sourceRange);
  local_20 = (void *)0x0;
  pIVar3 = BumpAllocator::
           emplace<slang::ast::InvalidExpression,decltype(nullptr),slang::ast::Type_const&>
                     (&comp->super_BumpAllocator,&local_20,comp->errorType);
  return &pIVar3->super_Expression;
}

Assistant:

const Expression& bindArgument(size_t argIndex, const ASTContext& context,
                                   const ExpressionSyntax& syntax, const Args& args) const final {
        if (argIndex == 0) {
            auto& comp = context.getCompilation();
            if (!NameSyntax::isKind(syntax.kind)) {
                context.addDiag(diag::ExpectedModuleName, syntax.sourceRange());
                return *comp.emplace<InvalidExpression>(nullptr, comp.getErrorType());
            }

            return ArbitrarySymbolExpression::fromSyntax(comp, syntax.as<NameSyntax>(), context,
                                                         LookupFlags::AllowRoot |
                                                             LookupFlags::AllowUnit);
        }

        return SystemTaskBase::bindArgument(argIndex, context, syntax, args);
    }